

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::AdvancedSyncVertexArray::Run(AdvancedSyncVertexArray *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  GLuint *buffers;
  GLuint *buffers_00;
  GLuint *buffers_01;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  long lVar4;
  allocator<char> local_89;
  GLuint *local_88;
  GLuint *local_80;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  vec4 local_58;
  vec4 local_48;
  
  bVar1 = ShaderImageLoadStoreBase::IsVSFSAvailable(&this->super_ShaderImageLoadStoreBase,3,0);
  if (bVar1) {
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "\nlayout(rgba32f, binding = 0) writeonly uniform image2D g_position_buffer;\nlayout(rgba32f, binding = 1) writeonly uniform image2D g_color_buffer;\nlayout(r32ui, binding = 2) writeonly uniform uimage2D g_element_buffer;\nuniform vec4 g_color;\nvoid main() {\n  vec2[4] data = vec2[4](vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1));\n  imageStore(g_position_buffer, ivec2(gl_VertexID,0), vec4(data[gl_VertexID], 0.0, 1.0));\n  imageStore(g_color_buffer, ivec2(gl_VertexID,0), g_color);\n  imageStore(g_element_buffer, ivec2(gl_VertexID,0), uvec4(gl_VertexID));\n}"
                       ,"\nvoid main() {\n  discard;\n}",false,false);
    this->m_store_program = GVar2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,
               "\n#define KSIZE 4\nlayout (local_size_x = KSIZE) in;\nlayout(rgba32f, binding = 0) readonly uniform image2D g_position_img;\nlayout(rgba32f, binding = 1) readonly uniform image2D g_color_img;\nlayout(r32ui, binding = 2) readonly uniform uimage2D g_element_img;\nlayout(std430, binding = 1) buffer g_position_buf {\n  vec2 g_pos[KSIZE];\n};\nlayout(std430, binding = 2) buffer g_color_buf {\n  vec4 g_col[KSIZE];\n};\nlayout(std430, binding = 3) buffer g_element_buf {\n  uint g_elem[KSIZE];\n};\nvoid main() {\n  ivec2 coord = ivec2(gl_LocalInvocationID.x, 0);\n  g_pos[coord.x] = (imageLoad(g_position_img, coord)).xy;\n  g_col[coord.x] = imageLoad(g_color_img, coord);\n  g_elem[coord.x] = uint((imageLoad(g_element_img, coord)).x);\n}"
               ,&local_89);
    GVar2 = ShaderImageLoadStoreBase::CreateComputeProgram
                      (&this->super_ShaderImageLoadStoreBase,(string *)&data,false);
    this->m_copy_program = GVar2;
    std::__cxx11::string::~string((string *)&data);
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "\nlayout(location = 0) in vec4 i_position;\nlayout(location = 1) in vec4 i_color;\nout vec4 vs_color;\nvoid main() {\n  gl_Position = i_position;\n  vs_color = i_color;\n}"
                       ,
                       "\nin vec4 vs_color;\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vs_color;\n}"
                       ,false,false);
    this->m_draw_program = GVar2;
    this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    textures = this->m_texture;
    glu::CallLogWrapper::glGenTextures(this_00,3,textures);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
              (&data,4,(allocator_type *)&local_89);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8814,4,1);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8814,4,1);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[2]);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8236,4,1);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    local_80 = &this->m_attribless_vao;
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,local_80);
    local_88 = &this->m_draw_vao;
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,local_88);
    glu::CallLogWrapper::glBindVertexArray(this_00,*local_88);
    buffers = &this->m_position_buffer;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
    buffers_00 = &this->m_color_buffer;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_00);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*buffers_00);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    buffers_01 = &this->m_element_buffer;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_01);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,*buffers_01);
    glu::CallLogWrapper::glBufferData(this_00,0x8893,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture(this_00,2,this->m_texture[2],0,'\0',0,0x88ba,0x8236);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_store_program);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_store_program,"g_color");
    glu::CallLogWrapper::glUniform4f(this_00,GVar3,0.0,1.0,0.0,1.0);
    glu::CallLogWrapper::glBindVertexArray(this_00,*local_80);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_copy_program);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,*buffers);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,*buffers_00);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,*buffers_01);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,*local_88);
    glu::CallLogWrapper::glMemoryBarrier(this_00,3);
    glu::CallLogWrapper::glDrawElements(this_00,5,4,0x1405,(void *)0x0);
    local_48.m_data[0] = 0.0;
    local_48.m_data[1] = 1.0;
    local_48.m_data[2] = 0.0;
    local_48.m_data[3] = 1.0;
    bVar1 = ShaderImageLoadStoreBase::CheckFB(&this->super_ShaderImageLoadStoreBase,&local_48);
    if (bVar1) {
      glu::CallLogWrapper::glUseProgram(this_00,this->m_store_program);
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_store_program,"g_color");
      glu::CallLogWrapper::glUniform4f(this_00,GVar3,0.0,0.0,1.0,1.0);
      glu::CallLogWrapper::glBindVertexArray(this_00,*local_80);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_copy_program);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,*local_88);
      glu::CallLogWrapper::glMemoryBarrier(this_00,3);
      glu::CallLogWrapper::glDrawElements(this_00,5,4,0x1405,(void *)0x0);
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      local_58.m_data[2] = 1.0;
      local_58.m_data[3] = 1.0;
      bVar1 = ShaderImageLoadStoreBase::CheckFB(&this->super_ShaderImageLoadStoreBase,&local_58);
      lVar4 = (ulong)bVar1 - 1;
    }
    else {
      lVar4 = -1;
    }
    std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
              (&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>)
    ;
  }
  else {
    lVar4 = 0x10;
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(3, 0))
			return NOT_SUPPORTED;
		const char* const glsl_store_vs =
			NL "layout(rgba32f, binding = 0) writeonly uniform image2D g_position_buffer;" NL
			   "layout(rgba32f, binding = 1) writeonly uniform image2D g_color_buffer;" NL
			   "layout(r32ui, binding = 2) writeonly uniform uimage2D g_element_buffer;" NL "uniform vec4 g_color;" NL
			   "void main() {" NL "  vec2[4] data = vec2[4](vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1));" NL
			   "  imageStore(g_position_buffer, ivec2(gl_VertexID,0), vec4(data[gl_VertexID], 0.0, 1.0));" NL
			   "  imageStore(g_color_buffer, ivec2(gl_VertexID,0), g_color);" NL
			   "  imageStore(g_element_buffer, ivec2(gl_VertexID,0), uvec4(gl_VertexID));" NL "}";
		const char* const glsl_store_fs = NL "void main() {" NL "  discard;" NL "}";
		const char*		  glsl_copy_cs =
			NL "#define KSIZE 4" NL "layout (local_size_x = KSIZE) in;" NL
			   "layout(rgba32f, binding = 0) readonly uniform image2D g_position_img;" NL
			   "layout(rgba32f, binding = 1) readonly uniform image2D g_color_img;" NL
			   "layout(r32ui, binding = 2) readonly uniform uimage2D g_element_img;" NL
			   "layout(std430, binding = 1) buffer g_position_buf {" NL "  vec2 g_pos[KSIZE];" NL "};" NL
			   "layout(std430, binding = 2) buffer g_color_buf {" NL "  vec4 g_col[KSIZE];" NL "};" NL
			   "layout(std430, binding = 3) buffer g_element_buf {" NL "  uint g_elem[KSIZE];" NL "};" NL
			   "void main() {" NL "  ivec2 coord = ivec2(gl_LocalInvocationID.x, 0);" NL
			   "  g_pos[coord.x] = (imageLoad(g_position_img, coord)).xy;" NL
			   "  g_col[coord.x] = imageLoad(g_color_img, coord);" NL
			   "  g_elem[coord.x] = uint((imageLoad(g_element_img, coord)).x);" NL "}";
		const char* const glsl_draw_vs = NL
			"layout(location = 0) in vec4 i_position;" NL "layout(location = 1) in vec4 i_color;" NL
			"out vec4 vs_color;" NL "void main() {" NL "  gl_Position = i_position;" NL "  vs_color = i_color;" NL "}";
		const char* const glsl_draw_fs = NL "in vec4 vs_color;" NL "layout(location = 0) out vec4 o_color;" NL
											"void main() {" NL "  o_color = vs_color;" NL "}";
		m_store_program = BuildProgram(glsl_store_vs, glsl_store_fs);
		m_copy_program  = CreateComputeProgram(glsl_copy_cs);
		m_draw_program  = BuildProgram(glsl_draw_vs, glsl_draw_fs);

		glGenTextures(3, m_texture);
		std::vector<ivec4> data(4);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, 4, 1);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, 4, 1);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glBindTexture(GL_TEXTURE_2D, m_texture[2]);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, 4, 1);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

		glGenVertexArrays(1, &m_attribless_vao);
		glGenVertexArrays(1, &m_draw_vao);
		glBindVertexArray(m_draw_vao);
		glGenBuffers(1, &m_position_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, m_position_buffer);
		glBufferData(GL_ARRAY_BUFFER, 4 * 4 * 4, 0, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glGenBuffers(1, &m_color_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, m_color_buffer);
		glBufferData(GL_ARRAY_BUFFER, 4 * 4 * 4, 0, GL_STATIC_DRAW);
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glGenBuffers(1, &m_element_buffer);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_element_buffer);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, 4 * 4 * 4, 0, GL_STATIC_DRAW);
		glBindVertexArray(0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(2, m_texture[2], 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		glUseProgram(m_store_program);
		glUniform4f(glGetUniformLocation(m_store_program, "g_color"), 0.0f, 1.0f, 0.0f, 1.0f);
		glBindVertexArray(m_attribless_vao);
		glDrawArrays(GL_POINTS, 0, 4);

		glUseProgram(m_copy_program);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_position_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_color_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_element_buffer);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(1, 1, 1);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_draw_vao);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT | GL_ELEMENT_ARRAY_BARRIER_BIT);
		glDrawElements(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0);

		if (!CheckFB(vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}

		glUseProgram(m_store_program);
		glUniform4f(glGetUniformLocation(m_store_program, "g_color"), 0.0f, 0.0f, 1.0f, 1.0f);
		glBindVertexArray(m_attribless_vao);
		glDrawArrays(GL_POINTS, 0, 4);
		glUseProgram(m_copy_program);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(1, 1, 1);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_draw_vao);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT | GL_ELEMENT_ARRAY_BARRIER_BIT);
		glDrawElements(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0);

		if (!CheckFB(vec4(0, 0, 1, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}